

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.h
# Opt level: O3

bool __thiscall spvtools::opt::LoopPeeling::CanPeelLoop(LoopPeeling *this)

{
  IRContext *this_00;
  CFG *this_01;
  BasicBlock *pBVar1;
  Instruction *this_02;
  bool bVar2;
  uint32_t blk_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  _Hash_node_base *p_Var4;
  bool bVar5;
  
  this_00 = this->context_;
  if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(this_00);
  }
  if (((this->loop_iteration_count_ != (Instruction *)0x0) && (this->int_type_ != (Integer *)0x0))
     && (*(int *)&(this->int_type_->super_Type).field_0x24 == 0x20)) {
    this_01 = (this_00->cfg_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
              _M_t.
              super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
              .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
    bVar2 = Loop::IsLCSSA(this->loop_);
    if (bVar2) {
      pBVar1 = this->loop_->loop_merge_;
      blk_id = 0;
      if (pBVar1 == (BasicBlock *)0x0) {
        return false;
      }
      this_02 = (pBVar1->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if (this_02->has_result_id_ == true) {
        blk_id = Instruction::GetSingleWordOperand(this_02,(uint)this_02->has_type_id_);
      }
      pvVar3 = CFG::preds(this_01,blk_id);
      if (((long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start == 4) &&
         (bVar2 = IsConditionCheckSideEffectFree(this), bVar2)) {
        p_Var4 = (this->exit_value_)._M_h._M_before_begin._M_nxt;
        if (p_Var4 == (_Hash_node_base *)0x0) {
          return true;
        }
        do {
          bVar5 = p_Var4[2]._M_nxt == (_Hash_node_base *)0x0;
          bVar2 = !bVar5;
          if (bVar5) {
            return bVar2;
          }
          p_Var4 = p_Var4->_M_nxt;
        } while (p_Var4 != (_Hash_node_base *)0x0);
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool CanPeelLoop() const {
    CFG& cfg = *context_->cfg();

    if (!loop_iteration_count_) {
      return false;
    }
    if (!int_type_) {
      return false;
    }
    if (int_type_->width() != 32) {
      return false;
    }
    if (!loop_->IsLCSSA()) {
      return false;
    }
    if (!loop_->GetMergeBlock()) {
      return false;
    }
    if (cfg.preds(loop_->GetMergeBlock()->id()).size() != 1) {
      return false;
    }
    if (!IsConditionCheckSideEffectFree()) {
      return false;
    }

    return !std::any_of(exit_value_.cbegin(), exit_value_.cend(),
                        [](std::pair<uint32_t, Instruction*> it) {
                          return it.second == nullptr;
                        });
  }